

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O1

void __thiscall
boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::setup
          (mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *this)

{
  uint64_t uVar1;
  __pid_t _Var2;
  u_int64_t res;
  ulong uVar3;
  int iVar4;
  size_t i;
  long lVar5;
  long lVar6;
  int ii;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  pthread_t local_50;
  undefined1 local_48 [16];
  
  lVar5 = 0;
  pthread_mutex_init((pthread_mutex_t *)&this->_mutex,(pthread_mutexattr_t *)0x0);
  _Var2 = getpid();
  local_50 = pthread_self();
  iVar4 = 0;
  do {
    iVar4 = iVar4 + (uint)(byte)local_48[lVar5 + -8];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  this->_pid = _Var2 + iVar4;
  this->_cptTotalProcessed = 0;
  if (this->_fastmode == true) {
    dVar10 = (((double)CONCAT44(0x45300000,(int)(this->_nelem >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)this->_nelem) - 4503599627370496.0)) *
             (double)this->_percent_elem_loaded_for_fastMode;
    uVar3 = (ulong)dVar10;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->setLevelFastmode,
               (long)(dVar10 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->bufferperThread,(long)this->_num_thread);
  if ((this->_writeEachLevel == true) && (0 < this->_num_thread)) {
    lVar5 = 0;
    lVar7 = 0;
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(((this->bufferperThread).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data + lVar5),10000);
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0x18;
    } while (lVar7 < this->_num_thread);
  }
  uVar1 = this->_nelem;
  auVar8._8_4_ = (int)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._12_4_ = 0x45300000;
  dVar10 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * this->_gamma;
  lVar5 = uVar1 - 1;
  auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar11._0_8_ = lVar5;
  auVar11._12_4_ = 0x45300000;
  dVar10 = pow((dVar10 + -1.0) / dVar10,
               (auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
  this->_proba_collision = 1.0 - dVar10;
  this->_nb_levels = 0x19;
  std::vector<boomphf::level,_std::allocator<boomphf::level>_>::resize(&this->_levels,0x19);
  if (0 < this->_nb_levels) {
    lVar6 = 0;
    lVar5 = 0;
    lVar7 = 0;
    do {
      *(long *)((long)&((this->_levels).
                        super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                        super__Vector_impl_data._M_start)->idx_begin + lVar6) = lVar7;
      auVar9._0_8_ = (double)CONCAT44(0x43300000,(int)this->_hash_domain);
      auVar9._8_4_ = (int)(this->_hash_domain >> 0x20);
      auVar9._12_4_ = 0x45300000;
      dVar10 = auVar9._8_8_ - 1.9342813113834067e+25;
      local_48._8_4_ = SUB84(dVar10,0);
      local_48._0_8_ = dVar10 + (auVar9._0_8_ - 4503599627370496.0);
      local_48._12_4_ = (int)((ulong)dVar10 >> 0x20);
      dVar10 = pow(this->_proba_collision,(double)(int)lVar5);
      uVar3 = (ulong)(dVar10 * (double)local_48._0_8_);
      uVar3 = ((long)(dVar10 * (double)local_48._0_8_ - 9.223372036854776e+18) & (long)uVar3 >> 0x3f
              | uVar3) + 0x3f & 0xffffffffffffffc0;
      if (uVar3 == 0) {
        uVar3 = 0x40;
      }
      *(ulong *)((long)&((this->_levels).
                         super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl
                         .super__Vector_impl_data._M_start)->hash_domain + lVar6) = uVar3;
      lVar7 = lVar7 + uVar3;
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x40;
    } while (lVar5 < this->_nb_levels);
  }
  if (0 < this->_nb_levels) {
    iVar4 = 0;
    do {
      dVar10 = pow(this->_proba_collision,(double)iVar4);
      if (dVar10 < (double)this->_percent_elem_loaded_for_fastMode) {
        this->_fastModeLevel = iVar4;
        return;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->_nb_levels);
  }
  return;
}

Assistant:

void setup()
		{
			pthread_mutex_init(&_mutex, NULL);

			_pid = getpid() + printPt(pthread_self()) ;// + pthread_self();
			//printf("pt self %llu  pid %i \n",printPt(pthread_self()),_pid);

			_cptTotalProcessed=0;

			
			if(_fastmode)
			{
				setLevelFastmode.resize(_percent_elem_loaded_for_fastMode * (double)_nelem );
			}

			
			bufferperThread.resize(_num_thread);
			if(_writeEachLevel)
			{
				for(int ii=0; ii<_num_thread; ii++)
				{
					bufferperThread[ii].resize(NBBUFF);
				}
			}
			
			_proba_collision = 1.0 -  pow(((_gamma*(double)_nelem -1 ) / (_gamma*(double)_nelem)),_nelem-1);

			double sum_geom =_gamma * ( 1.0 +  _proba_collision / (1.0 - _proba_collision));
			//printf("proba collision %f  sum_geom  %f   \n",_proba_collision,sum_geom);

			_nb_levels = 25;
			_levels.resize(_nb_levels);

			//build levels
			uint64_t previous_idx =0;
			for(int ii=0; ii<_nb_levels; ii++)
			{

				_levels[ii].idx_begin = previous_idx;

				// round size to nearest superior multiple of 64, makes it easier to clear a level
				_levels[ii].hash_domain =  (( (uint64_t) (_hash_domain * pow(_proba_collision,ii)) + 63) / 64 ) * 64;
				if(_levels[ii].hash_domain == 0 ) _levels[ii].hash_domain  = 64 ;
				previous_idx += _levels[ii].hash_domain;

				//printf("build level %i bit array : start %12llu, size %12llu  ",ii,_levels[ii]->idx_begin,_levels[ii]->hash_domain );
				//printf(" expected elems : %.2f %% total \n",100.0*pow(_proba_collision,ii));

			}
			
			for(int ii=0; ii<_nb_levels; ii++)
			{
				 if(pow(_proba_collision,ii) < _percent_elem_loaded_for_fastMode)
				 {
				 	_fastModeLevel = ii;
				 	 //printf("fast mode level :  %i \n",ii);
				 	break;
				 }
			}
		}